

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIConfigureLog.cxx
# Opt level: O2

Value * cmFileAPIConfigureLogDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  string *a;
  Value *pVVar1;
  Value VStack_68;
  Value local_40;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  a = cmake::GetHomeOutputDirectory_abi_cxx11_(fileAPI->CMakeInstance);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[35]>
            ((string *)&local_40,a,(char (*) [35])"/CMakeFiles/CMakeConfigureLog.yaml");
  Json::Value::Value(&VStack_68,(String *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(pVVar1,&VStack_68);
  Json::Value::~Value(&VStack_68);
  Json::Value::Value(&local_40,arrayValue);
  if (version == 1) {
    Json::Value::Value(&VStack_68,"message-v1");
    Json::Value::append(&local_40,&VStack_68);
    Json::Value::~Value(&VStack_68);
    Json::Value::Value(&VStack_68,"try_compile-v1");
    Json::Value::append(&local_40,&VStack_68);
    Json::Value::~Value(&VStack_68);
    Json::Value::Value(&VStack_68,"try_run-v1");
    Json::Value::append(&local_40,&VStack_68);
    Json::Value::~Value(&VStack_68);
  }
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"eventKindNames");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPIConfigureLogDump(cmFileAPI& fileAPI,
                                      unsigned long version)
{
  ConfigureLog configureLog(fileAPI, version);
  return configureLog.Dump();
}